

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cbaNtk.c
# Opt level: O1

int Cba_NtkCheckComboLoop_rec(Cba_Ntk_t *p,int iObj)

{
  Vec_Int_t *p_00;
  uint uVar1;
  uint uVar2;
  int iVar3;
  ulong uVar4;
  uint nSize;
  ulong uVar5;
  
  if (iObj < 1) {
    __assert_fail("i>0",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/antmicro[P]abc-lib/src/base/cba/cba.h"
                  ,0x142,"Cba_ObjType_t Cba_ObjType(Cba_Ntk_t *, int)");
  }
  if ((p->vObjType).nSize <= iObj) {
LAB_00334de8:
    __assert_fail("i >= 0 && i < p->nSize",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/antmicro[P]abc-lib/src/misc/vec/vecStr.h"
                  ,0x164,"char Vec_StrEntry(Vec_Str_t *, int)");
  }
  if ((p->vObjType).pArray[(uint)iObj] == '\x01') {
    return 1;
  }
  if ((p->vObjCopy).nSize < 1) {
LAB_00334e45:
    __assert_fail("Cba_NtkHasObjCopies(p)",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/antmicro[P]abc-lib/src/base/cba/cba.h"
                  ,0x15b,"int Cba_ObjCopy(Cba_Ntk_t *, int)");
  }
  p_00 = &p->vObjCopy;
  nSize = iObj + 1;
  Vec_IntFillExtra(p_00,nSize,-1);
  iVar3 = (p->vObjCopy).nSize;
  if (iObj < iVar3) {
    if ((p->vObjCopy).pArray[(uint)iObj] == 1) {
      return 1;
    }
    if (iVar3 < 1) goto LAB_00334e45;
    Vec_IntFillExtra(p_00,nSize,-1);
    if (iObj < (p->vObjCopy).nSize) {
      if ((p->vObjCopy).pArray[(uint)iObj] == 0) {
        return 0;
      }
      Cba_ObjSetCopy(p,iObj,0);
      if ((iObj < (p->vObjFin0).nSize) && ((int)nSize < (p->vObjFin0).nSize)) {
        uVar1 = (p->vObjFin0).pArray[(uint)iObj];
        uVar4 = (ulong)uVar1;
        do {
          if ((p->vObjFin0).pArray[nSize] <= (int)uVar4) {
            Vec_IntFillExtra(p_00,nSize,0);
            if ((p->vObjCopy).nSize <= iObj) {
              __assert_fail("i >= 0 && i < p->nSize",
                            "/workspace/llm4binary/github/license_all_cmakelists_25/antmicro[P]abc-lib/src/misc/vec/vecInt.h"
                            ,0x1c0,"void Vec_IntWriteEntry(Vec_Int_t *, int, int)");
            }
            (p->vObjCopy).pArray[(uint)iObj] = 1;
            return 1;
          }
          if ((int)uVar1 < 1) {
            __assert_fail("f>0",
                          "/workspace/llm4binary/github/license_all_cmakelists_25/antmicro[P]abc-lib/src/base/cba/cba.h"
                          ,0x169,"int Cba_FinFon(Cba_Ntk_t *, int)");
          }
          if ((p->vFinFon).nSize <= (int)uVar4) break;
          iVar3 = (p->vFinFon).pArray[uVar4];
          if ((long)iVar3 < 1) {
            uVar5 = 0;
          }
          else {
            if ((p->vFonObj).nSize <= iVar3) break;
            uVar5 = (ulong)(uint)(p->vFonObj).pArray[iVar3];
          }
          iVar3 = (int)uVar5;
          if (iVar3 != 0) {
            if (iVar3 < 1) {
              __assert_fail("i>0",
                            "/workspace/llm4binary/github/license_all_cmakelists_25/antmicro[P]abc-lib/src/base/cba/cba.h"
                            ,0x175,"int Cba_ObjIsSeq(Cba_Ntk_t *, int)");
            }
            if ((p->vObjType).nSize <= iVar3) goto LAB_00334de8;
            uVar2 = (uint)(byte)(p->vObjType).pArray[uVar5];
            if (uVar2 == 3) {
              if ((p->vObjFunc).nSize < 1) {
                uVar2 = 0;
              }
              else {
                Vec_IntFillExtra(&p->vObjFunc,iVar3 + 1,0);
                if ((p->vObjFunc).nSize <= iVar3) break;
                uVar2 = (p->vObjFunc).pArray[uVar5];
              }
              uVar2 = *(uint *)((long)(p->pDesign->vNtks).pArray[uVar2] + 0x14) >> 2 & 1;
            }
            else {
              uVar2 = (uint)(uVar2 - 0x4c < 0xc);
            }
            if ((uVar2 == 0) && (iVar3 = Cba_NtkCheckComboLoop_rec(p,iVar3), iVar3 == 0)) {
              return 0;
            }
          }
          uVar4 = uVar4 + 1;
        } while ((int)nSize < (p->vObjFin0).nSize);
      }
    }
  }
  __assert_fail("i >= 0 && i < p->nSize",
                "/workspace/llm4binary/github/license_all_cmakelists_25/antmicro[P]abc-lib/src/misc/vec/vecInt.h"
                ,0x19e,"int Vec_IntEntry(Vec_Int_t *, int)");
}

Assistant:

int Cba_NtkCheckComboLoop_rec( Cba_Ntk_t * p, int iObj )
{
    int k, iFin, iFanin;
    if ( Cba_ObjIsPi(p, iObj) )
        return 1;
    if ( Cba_ObjCopy(p, iObj) == 1 ) // visited
        return 1;
    if ( Cba_ObjCopy(p, iObj) == 0 ) // loop
        return 0;
    Cba_ObjSetCopy( p, iObj, 0 );
    Cba_ObjForEachFinFaninReal( p, iObj, iFin, iFanin, k )
        if ( !Cba_ObjIsSeq(p, iFanin) )
            if ( !Cba_NtkCheckComboLoop_rec( p, iFanin ) )
                return 0;
    //Cba_ObjSetCopy( p, iObj, 1 );
    Vec_IntSetEntry( &p->vObjCopy, iObj, 1 );
    return 1;
}